

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::BaseCompiler::addFuncNode
          (BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  BaseBuilder *in_RDX;
  FuncSignature *in_stack_00000008;
  Error _err;
  State state;
  FuncNode *in_stack_ffffffffffffffc8;
  BaseCompiler *in_stack_ffffffffffffffd0;
  BaseNode *in_stack_ffffffffffffffd8;
  Error local_4;
  
  BaseEmitter::_grabState((BaseEmitter *)in_stack_ffffffffffffffd0);
  local_4 = newFuncNode((BaseCompiler *)state._8_8_,(FuncNode **)state._0_8_,in_stack_00000008);
  if (local_4 == 0) {
    BaseBuilder_assignInlineComment
              (in_RDX,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
    addFunc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Error BaseCompiler::addFuncNode(FuncNode** out, const FuncSignature& signature) {
  State state = _grabState();

  ASMJIT_PROPAGATE(newFuncNode(out, signature));
  ASMJIT_ASSUME(*out != nullptr);

  BaseBuilder_assignInlineComment(this, *out, state.comment);

  addFunc(*out);
  return kErrorOk;
}